

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

int Bal_ManSetGateLevel(Bal_Man_t *p,Gia_Obj_t *pObjOld,int iLitNew)

{
  uint uVar1;
  Gia_Man_t *pGVar2;
  uint *puVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Vec_Ptr_t *pVVar11;
  int in_R9D;
  int Target;
  uint iFan0;
  bool bVar12;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffb8;
  
  if (-1 < iLitNew) {
    uVar8 = (uint)iLitNew >> 1;
    pGVar2 = p->pNew;
    if (pGVar2->nObjs <= (int)uVar8) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    puVar3 = pGVar2->pMuxes;
    if (puVar3 == (uint *)0x0) {
      bVar12 = true;
    }
    else {
      bVar12 = puVar3[uVar8] == 0;
    }
    pVVar11 = p->vCutSets;
    if ((int)uVar8 < pVVar11->nSize) {
      return -1;
    }
    if ((bool)(puVar3 == (uint *)0x0 | bVar12)) {
      uVar9 = bVar12 - 1;
    }
    else {
      uVar9 = puVar3[uVar8];
      if (uVar9 == 0) {
        uVar9 = 0xffffffff;
      }
      else {
        if ((int)uVar9 < 0) goto LAB_006899b5;
        uVar9 = uVar9 >> 1;
      }
      if ((int)puVar3[uVar8] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
    }
    iFan0 = uVar8 - ((uint)*(undefined8 *)(pGVar2->pObjs + uVar8) & 0x1fffffff);
    if (-1 < (int)iFan0) {
      uVar1 = p->vCosts->nSize;
      if (((((int)iFan0 < (int)uVar1) &&
           (uVar8 = uVar8 - ((uint)((ulong)*(undefined8 *)(pGVar2->pObjs + uVar8) >> 0x20) &
                            0x1fffffff), -1 < (int)uVar8)) && (uVar8 < uVar1)) &&
         ((-1 < (int)uVar9 && (uVar9 < uVar1)))) {
        piVar4 = p->vCosts->pArray;
        iVar5 = piVar4[iFan0] >> 4;
        iVar7 = piVar4[uVar8] >> 4;
        iVar10 = piVar4[uVar9] >> 4;
        iVar6 = iVar10;
        if (iVar10 < iVar7) {
          iVar6 = iVar7;
        }
        Target = iVar6;
        if (iVar6 < iVar5) {
          Target = iVar5;
        }
        if ((0 < Target) &&
           (iVar6 = Bal_ManDeriveCuts(p,iFan0,uVar8,uVar9,(int)pVVar11,in_R9D,
                                      in_stack_ffffffffffffff98,(uint)(iVar5 < iVar6),
                                      (uint)(iVar7 != Target),(uint)(iVar10 != Target),
                                      in_stack_ffffffffffffffb8,Target,1), -1 < iVar6)) {
          return iVar6;
        }
        iVar6 = Bal_ManDeriveCuts(p,iFan0,uVar8,uVar9,(int)pVVar11,in_R9D,in_stack_ffffffffffffff98,
                                  1,1,1,in_stack_ffffffffffffffb8,Target + 1,1);
        if (-1 < iVar6) {
          return iVar6;
        }
        __assert_fail("Cost >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalLut.c"
                      ,0x20b,"int Bal_ManSetGateLevel(Bal_Man_t *, Gia_Obj_t *, int)");
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
LAB_006899b5:
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf2,"int Abc_Lit2Var(int)");
}

Assistant:

int Bal_ManSetGateLevel( Bal_Man_t * p, Gia_Obj_t * pObjOld, int iLitNew )
{
    int iFan0, iFan1, iFan2, Cost;
    int fCompl0, fCompl1, fCompl2;
    int fUnit0, fUnit1, fUnit2;
    int Delay0, Delay1, Delay2, DelayMax;
    int iObjNew = Abc_Lit2Var(iLitNew);
    Gia_Obj_t * pObjNew = Gia_ManObj( p->pNew, iObjNew );
    int fMux = Gia_ObjIsMux(p->pNew, pObjNew);
    if ( iObjNew < Vec_PtrSize(p->vCutSets) )
        return -1;
    iFan0    = Gia_ObjFaninId0( pObjNew, iObjNew );
    iFan1    = Gia_ObjFaninId1( pObjNew, iObjNew );
    iFan2    = fMux ? Gia_ObjFaninId2(p->pNew, iObjNew) : 0;
    fCompl0  = Gia_ObjFaninC0( pObjNew );
    fCompl1  = Gia_ObjFaninC1( pObjNew );
    fCompl2  = fMux ? Gia_ObjFaninC2(p->pNew, pObjNew) : 0;
    Delay0   = Bal_ObjDelay( p, iFan0 );
    Delay1   = Bal_ObjDelay( p, iFan1 );
    Delay2   = Bal_ObjDelay( p, iFan2 );
    DelayMax = Abc_MaxInt( Delay0, Abc_MaxInt(Delay1, Delay2) );
    fUnit0   = (int)(Delay0 != DelayMax); 
    fUnit1   = (int)(Delay1 != DelayMax); 
    fUnit2   = (int)(Delay2 != DelayMax); 
    if ( DelayMax > 0 )
    {
//printf( "A" );
        Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
        if ( Cost >= 0 )
            return Cost;
    }
    DelayMax++;
    fUnit0 = fUnit1 = fUnit2 = 1;
//printf( "A" );
    Cost = Bal_ManDeriveCuts(p, iFan0, iFan1, iFan2, fCompl0, fCompl1, fCompl2, fUnit0, fUnit1, fUnit2, Gia_ObjIsXor(pObjNew), DelayMax, 1 );
//printf( "B" );
    assert( Cost >= 0 );
    return Cost;
}